

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

string * __thiscall
soul::heart::Printer::PrinterStream::nameWithArray_abi_cxx11_
          (string *__return_storage_ptr__,PrinterStream *this,Identifier *name,
          optional<unsigned_int> *arraySize)

{
  bool bVar1;
  uint *puVar2;
  string *psVar3;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Identifier *local_20;
  optional<unsigned_int> *arraySize_local;
  Identifier *name_local;
  
  local_20 = name;
  arraySize_local = (optional<unsigned_int> *)this;
  name_local = (Identifier *)__return_storage_ptr__;
  bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)name);
  if (bVar1) {
    psVar3 = Identifier::toString_abi_cxx11_((Identifier *)arraySize_local);
    std::operator+(&local_60,psVar3,'[');
    puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)local_20);
    std::__cxx11::to_string(&local_80,*puVar2);
    std::operator+(&local_40,&local_60,&local_80);
    std::operator+(__return_storage_ptr__,&local_40,']');
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    psVar3 = Identifier::toString_abi_cxx11_((Identifier *)arraySize_local);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string nameWithArray (const soul::Identifier& name, const std::optional<uint32_t>& arraySize)
        {
            if (arraySize.has_value())
                return name.toString() + '[' + std::to_string (*arraySize) + ']';

            return name.toString();
        }